

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O2

void anon_unknown.dwarf_a902a::readCopyWriteTest(string *tempDir,int channelCount,int testTimes)

{
  PixelType PVar1;
  long lVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  char cVar5;
  __type _Var6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  string *psVar10;
  void *pvVar11;
  Header *pHVar12;
  Box<Imath_3_2::Vec2<int>_> *pBVar13;
  Box<Imath_3_2::Vec2<int>_> *pBVar14;
  float *pfVar15;
  float *pfVar16;
  int *piVar17;
  ChannelList *this;
  ChannelList *pCVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar19;
  uint uVar20;
  int i_1;
  int iVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  PixelType PVar25;
  ulong uVar26;
  Compression CVar27;
  int j;
  long lVar28;
  long lVar29;
  long lVar30;
  int i;
  long lVar31;
  int k;
  long lVar32;
  float fVar33;
  float fVar34;
  int local_348;
  Array<Imf_3_4::Array2D<void_*>_> data_1;
  DeepScanLineOutputFile file;
  Array<Imf_3_4::Array2D<void_*>_> data;
  int type;
  _Base_ptr local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  long local_2a0;
  string copy_filename;
  string source_filename;
  DeepFrameBuffer frameBuffer;
  Channel local_1f0 [56];
  stringstream ss;
  undefined1 local_1a8 [376];
  
  poVar9 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,channelCount);
  poVar9 = std::operator<<(poVar9," channels ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,testTimes);
  poVar9 = std::operator<<(poVar9," times.");
  std::endl<char,std::char_traits<char>>(poVar9);
  std::ostream::flush();
  std::operator+(&source_filename,tempDir,"imf_test_copy_deep_scanline_source.exr");
  std::operator+(&copy_filename,tempDir,"imf_test_copy_deep_scanline_copy.exr");
  uVar23 = 0;
  uVar19 = 0;
  if (0 < channelCount) {
    uVar19 = (ulong)(uint)channelCount;
  }
  uVar26 = (ulong)(uint)testTimes;
  if (testTimes < 1) {
    uVar26 = uVar23;
  }
  local_2b0 = uVar19 * 0x18;
  local_2b8 = (_Base_ptr)(ulong)(uint)channelCount;
  do {
    if ((int)uVar23 == (int)uVar26) {
      std::__cxx11::string::~string((string *)&copy_filename);
      std::__cxx11::string::~string((string *)&source_filename);
      return;
    }
    local_2a8 = uVar23;
    std::operator<<((ostream *)&std::cout,"generating ");
    std::ostream::flush();
    frameBuffer._map._M_t._M_impl._0_8_ = 0;
    CVar27 = (Compression)(uVar23 % 3);
    Imf_3_4::Header::Header
              ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
               (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
               CVar27);
    Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
    Imf_3_4::Header::~Header((Header *)&ss);
    poVar9 = std::operator<<((ostream *)&std::cout,"compression ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,CVar27);
    std::operator<<(poVar9," ");
    std::ostream::flush();
    if (DAT_001d1128 != (anonymous_namespace)::channelTypes) {
      DAT_001d1128 = (anonymous_namespace)::channelTypes;
    }
    for (iVar21 = 0; local_348 = (int)uVar19, local_348 != iVar21; iVar21 = iVar21 + 1) {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,iVar21);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar10 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel(local_1f0,UINT,1,1,false);
        Imf_3_4::ChannelList::insert(psVar10,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar10 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel(local_1f0,HALF,1,1,false);
        Imf_3_4::ChannelList::insert(psVar10,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar10 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel(local_1f0,FLOAT,1,1,false);
        Imf_3_4::ChannelList::insert(psVar10,(Channel *)&frameBuffer);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::channelTypes,&type);
      std::__cxx11::string::~string((string *)&frameBuffer);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
    Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)local_2b8);
    for (sVar22 = 0; local_2b0 != sVar22; sVar22 = sVar22 + 0x18) {
      Imf_3_4::Array2D<void_*>::resizeErase
                ((Array2D<void_*> *)((long)&(data._data)->_sizeX + sVar22),0xea,0x21a);
    }
    Imf_3_4::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,0xea,0x21a);
    remove(source_filename._M_dataplus._M_p);
    Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
              (&file,source_filename._M_dataplus._M_p,(Header *)(anonymous_namespace)::header,8);
    Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
    Imf_3_4::Slice::Slice
              ((Slice *)&ss,UINT,
               (char *)((anonymous_namespace)::sampleCount._16_8_ +
                        (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_001d1104 * -0x868),
               4,0x868,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
    lVar31 = 0x10;
    for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
      PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar23 * 4);
      PVar25 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar25 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar25 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar23);
      std::__cxx11::stringbuf::str();
      iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
      uVar24 = (ulong)(iVar21 == 0) << 2;
      if (iVar21 == 1) {
        uVar24 = 2;
      }
      if (iVar21 == 2) {
        uVar24 = 4;
      }
      Imf_3_4::DeepSlice::DeepSlice
                ((DeepSlice *)local_1f0,PVar25,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar31) +
                          (long)(anonymous_namespace)::dataWindow * -8 +
                         (long)DAT_001d1104 * -0x10d0),8,0x10d0,uVar24,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      lVar31 = lVar31 + 0x18;
    }
    Imf_3_4::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
    std::operator<<((ostream *)&std::cout,"writing ");
    std::ostream::flush();
    lVar31 = 0;
    while( true ) {
      if (lVar31 == 0xea) break;
      for (lVar28 = 0; lVar28 != 0x21a; lVar28 = lVar28 + 1) {
        iVar21 = random_int(10);
        lVar30 = (anonymous_namespace)::sampleCount._16_8_;
        lVar32 = (anonymous_namespace)::sampleCount._8_8_;
        *(int *)((anonymous_namespace)::sampleCount._16_8_ +
                 (anonymous_namespace)::sampleCount._8_8_ * lVar31 * 4 + lVar28 * 4) = iVar21 + 1;
        uVar20 = (uint)((int)lVar31 * 0x21a + (int)lVar28) % 0x801;
        fVar33 = (float)uVar20;
        for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
          if (iVar21 == 0) {
            pvVar11 = operator_new__((ulong)*(uint *)(lVar30 + lVar32 * lVar31 * 4 + lVar28 * 4) <<
                                     2);
            data._data[uVar23]._data[data._data[uVar23]._sizeY * lVar31 + lVar28] = pvVar11;
            iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
            lVar30 = (anonymous_namespace)::sampleCount._16_8_;
          }
          if (iVar21 == 1) {
            pvVar11 = operator_new__((ulong)*(uint *)(lVar30 + lVar32 * lVar31 * 4 + lVar28 * 4) * 2
                                    );
            data._data[uVar23]._data[data._data[uVar23]._sizeY * lVar31 + lVar28] = pvVar11;
            iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
            lVar30 = (anonymous_namespace)::sampleCount._16_8_;
          }
          if (iVar21 == 2) {
            pvVar11 = operator_new__((ulong)*(uint *)(lVar30 + lVar32 * lVar31 * 4 + lVar28 * 4) <<
                                     2);
            data._data[uVar23]._data[data._data[uVar23]._sizeY * lVar31 + lVar28] = pvVar11;
            lVar30 = (anonymous_namespace)::sampleCount._16_8_;
          }
          lVar29 = 0;
          for (uVar24 = 0; lVar2 = (anonymous_namespace)::channelTypes,
              uVar24 < *(uint *)(lVar30 + lVar32 * lVar31 * 4 + lVar28 * 4); uVar24 = uVar24 + 1) {
            iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
            if (iVar21 == 0) {
              *(uint *)((long)data._data[uVar23]._data[data._data[uVar23]._sizeY * lVar31 + lVar28]
                       + lVar29 * 2) = uVar20;
              iVar21 = *(int *)(lVar2 + uVar23 * 4);
            }
            if (iVar21 == 1) {
              Imath_3_2::half::operator=
                        ((half *)((long)data._data[uVar23]._data
                                        [data._data[uVar23]._sizeY * lVar31 + lVar28] + lVar29),
                         fVar33);
              iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
              lVar30 = (anonymous_namespace)::sampleCount._16_8_;
              lVar32 = (anonymous_namespace)::sampleCount._8_8_;
            }
            if (iVar21 == 2) {
              *(float *)((long)data._data[uVar23]._data[data._data[uVar23]._sizeY * lVar31 + lVar28]
                        + lVar29 * 2) = fVar33;
            }
            lVar29 = lVar29 + 2;
          }
        }
      }
      lVar31 = lVar31 + 1;
    }
    Imf_3_4::DeepScanLineOutputFile::writePixels((int)&file);
    for (lVar31 = 0; lVar31 != 0xea; lVar31 = lVar31 + 1) {
      for (lVar28 = 0; lVar28 != 0x21a; lVar28 = lVar28 + 1) {
        lVar32 = 4;
        for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
          if (iVar21 == 0) {
            pvVar11 = *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar31 * 8 +
                                 *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) + lVar28 * 8);
            if (pvVar11 != (void *)0x0) {
              operator_delete__(pvVar11);
              iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
              goto LAB_0013e695;
            }
          }
          else {
LAB_0013e695:
            if (iVar21 == 1) {
              pvVar11 = *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar31 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) + lVar28 * 8)
              ;
              if (pvVar11 == (void *)0x0) goto LAB_0013e6f2;
              operator_delete__(pvVar11);
              iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
            }
            if ((iVar21 == 2) &&
               (pvVar11 = *(void **)(*(long *)((long)data._data + lVar32 * 4 + -8) * lVar31 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar32 * 4) +
                                    lVar28 * 8), pvVar11 != (void *)0x0)) {
              operator_delete__(pvVar11);
            }
          }
LAB_0013e6f2:
          lVar32 = lVar32 + 6;
        }
      }
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
    Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
    std::operator<<((ostream *)&std::cout,"copying ");
    std::ostream::flush();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&ss,source_filename._M_dataplus._M_p,8);
    remove(copy_filename._M_dataplus._M_p);
    _Var3 = copy_filename._M_dataplus;
    pHVar12 = (Header *)Imf_3_4::DeepScanLineInputFile::header();
    Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
              ((DeepScanLineOutputFile *)&frameBuffer,_Var3._M_p,pHVar12,8);
    Imf_3_4::DeepScanLineOutputFile::copyPixels((DeepScanLineInputFile *)&frameBuffer);
    Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)&frameBuffer)
    ;
    Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&ss);
    std::operator<<((ostream *)&std::cout,"reading ");
    std::ostream::flush();
    Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&type,copy_filename._M_dataplus._M_p,8);
    Imf_3_4::DeepScanLineInputFile::header();
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
    bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar13,pBVar14);
    if (!bVar4) {
      __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xcf,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
    bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar13,pBVar14);
    if (!bVar4) {
      __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd0,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    pfVar15 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar33 = *pfVar15;
    pfVar15 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar33 != *pfVar15) || (NAN(fVar33) || NAN(*pfVar15))) {
      __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd1,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    pfVar15 = (float *)Imf_3_4::Header::screenWindowCenter();
    pfVar16 = (float *)Imf_3_4::Header::screenWindowCenter();
    if ((((*pfVar15 != *pfVar16) || (NAN(*pfVar15) || NAN(*pfVar16))) || (pfVar15[1] != pfVar16[1]))
       || (NAN(pfVar15[1]) || NAN(pfVar16[1]))) {
      __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd2,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    pfVar15 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar33 = *pfVar15;
    pfVar15 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar33 != *pfVar15) || (NAN(fVar33) || NAN(*pfVar15))) {
      __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd3,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    piVar17 = (int *)Imf_3_4::Header::lineOrder();
    iVar21 = *piVar17;
    piVar17 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar21 != *piVar17) {
      __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd4,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    piVar17 = (int *)Imf_3_4::Header::compression();
    iVar21 = *piVar17;
    piVar17 = (int *)Imf_3_4::Header::compression();
    if (iVar21 != *piVar17) {
      __assert_fail("fileHeader.compression () == header.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd5,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    this = (ChannelList *)Imf_3_4::Header::channels();
    pCVar18 = (ChannelList *)Imf_3_4::Header::channels();
    cVar5 = Imf_3_4::ChannelList::operator==(this,pCVar18);
    if (cVar5 == '\0') {
      __assert_fail("fileHeader.channels () == header.channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd6,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::type_abi_cxx11_();
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::type_abi_cxx11_();
    _Var6 = std::operator==(__lhs,__rhs);
    if (!_Var6) {
      __assert_fail("fileHeader.type () == header.type ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                    ,0xd7,"void (anonymous namespace)::readFile(const std::string &, int)");
    }
    _file = 0;
    Imf_3_4::Array2D<unsigned_int>::resizeErase((Array2D<unsigned_int> *)&file,0xea,0x21a);
    Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data_1,(long)local_2b8);
    for (sVar22 = 0; local_2b0 != sVar22; sVar22 = sVar22 + 0x18) {
      Imf_3_4::Array2D<void_*>::resizeErase
                ((Array2D<void_*> *)((long)&(data_1._data)->_sizeX + sVar22),0xea,0x21a);
    }
    Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
    Imf_3_4::Slice::Slice
              ((Slice *)&ss,UINT,
               (char *)((long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_001d1104 * -0x868),
               4,0x868,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
    lVar31 = 0x10;
    for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
      PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar23 * 4);
      PVar25 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar25 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar25 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar23);
      std::__cxx11::stringbuf::str();
      iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
      uVar24 = (ulong)(iVar21 == 0) << 2;
      if (iVar21 == 1) {
        uVar24 = 2;
      }
      if (iVar21 == 2) {
        uVar24 = 4;
      }
      Imf_3_4::DeepSlice::DeepSlice
                ((DeepSlice *)local_1f0,PVar25,
                 (char *)(*(long *)((long)&(data_1._data)->_sizeX + lVar31) +
                          (long)(anonymous_namespace)::dataWindow * -8 +
                         (long)DAT_001d1104 * -0x10d0),8,0x10d0,uVar24,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&data);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      lVar31 = lVar31 + 0x18;
    }
    Imf_3_4::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&type);
    Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts
              ((int)(DeepFrameBuffer *)&type,DAT_001d1104);
    iVar21 = DAT_001d1104;
    iVar7 = DAT_001d110c - DAT_001d1104;
    local_2a0 = (anonymous_namespace)::sampleCount._8_8_ << 2;
    lVar31 = 0;
    for (lVar28 = 0; lVar28 <= iVar7; lVar28 = lVar28 + 1) {
      lVar32 = 0;
      while (lVar32 != 0x21a) {
        piVar17 = (int *)(lVar32 * 4);
        lVar30 = lVar32 * 4;
        lVar32 = lVar32 + 1;
        if (*piVar17 != *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar31 + lVar30)) {
          __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                        ,0x10b,"void (anonymous namespace)::readFile(const std::string &, int)");
        }
      }
      for (lVar32 = 0; lVar32 != 0x21a; lVar32 = lVar32 + 1) {
        lVar30 = 4;
        for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
          iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
          if (iVar8 == 0) {
            pvVar11 = operator_new__((ulong)*(uint *)(lVar32 * 4) << 2);
            *(void **)(*(long *)((long)data_1._data + lVar30 * 4 + -8) * lVar28 * 8 +
                       *(long *)((long)&(data_1._data)->_sizeX + lVar30 * 4) + lVar32 * 8) = pvVar11
            ;
            iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
          }
          if (iVar8 == 1) {
            pvVar11 = operator_new__((ulong)*(uint *)(lVar32 * 4) * 2);
            *(void **)(*(long *)((long)data_1._data + lVar30 * 4 + -8) * lVar28 * 8 +
                       *(long *)((long)&(data_1._data)->_sizeX + lVar30 * 4) + lVar32 * 8) = pvVar11
            ;
            iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
          }
          if (iVar8 == 2) {
            pvVar11 = operator_new__((ulong)*(uint *)(lVar32 * 4) << 2);
            *(void **)(*(long *)((long)data_1._data + lVar30 * 4 + -8) * lVar28 * 8 +
                       *(long *)((long)&(data_1._data)->_sizeX + lVar30 * 4) + lVar32 * 8) = pvVar11
            ;
          }
          lVar30 = lVar30 + 6;
        }
      }
      lVar31 = lVar31 + local_2a0;
    }
    Imf_3_4::DeepScanLineInputFile::readPixels((int)&type,iVar21);
    for (lVar31 = 0; lVar31 != 0xea; lVar31 = lVar31 + 1) {
      iVar21 = (int)lVar31;
      for (lVar28 = 0; lVar28 != 0x21a; lVar28 = lVar28 + 1) {
        iVar7 = (int)lVar28;
        uVar20 = (uint)(iVar21 * 0x21a + iVar7) % 0x801;
        fVar33 = (float)uVar20;
        for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
          for (uVar24 = 0;
              uVar24 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar31 * 4 +
                                 (anonymous_namespace)::sampleCount._16_8_ + lVar28 * 4);
              uVar24 = uVar24 + 1) {
            iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
            if (iVar8 == 0) {
              pvVar11 = data_1._data[uVar23]._data[data_1._data[uVar23]._sizeY * lVar31 + lVar28];
              if (*(uint *)((long)pvVar11 + uVar24 * 4) != uVar20) {
                poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
                poVar9 = std::operator<<(poVar9,", ");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar21);
                poVar9 = std::operator<<(poVar9," error, should be ");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar20);
                poVar9 = std::operator<<(poVar9,", is ");
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                std::endl<char,std::char_traits<char>>(poVar9);
                std::ostream::flush();
                if (*(uint *)((long)pvVar11 + uVar24 * 4) != uVar20) {
                  __assert_fail("value[l] == static_cast<unsigned int> (i * width + j) % 2049",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                ,0x12e,
                                "void (anonymous namespace)::readFile(const std::string &, int)");
                }
                iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
                goto LAB_0013ee98;
              }
            }
            else {
LAB_0013ee98:
              if (iVar8 == 1) {
                pvVar11 = data_1._data[uVar23]._data[data_1._data[uVar23]._sizeY * lVar31 + lVar28];
                fVar34 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)((long)pvVar11 + uVar24 * 2) * 4);
                if ((fVar34 != fVar33) || (NAN(fVar34) || NAN(fVar33))) {
                  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
                  poVar9 = std::operator<<(poVar9,", ");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar21);
                  poVar9 = std::operator<<(poVar9," error, should be ");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar20);
                  poVar9 = std::operator<<(poVar9,", is ");
                  poVar9 = (ostream *)
                           ::operator<<(poVar9,(half)*(uint16_t *)((long)pvVar11 + uVar24 * 2));
                  std::endl<char,std::char_traits<char>>(poVar9);
                  std::ostream::flush();
                  fVar34 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)
                                             ((long)data_1._data[uVar23]._data
                                                    [data_1._data[uVar23]._sizeY * lVar31 + lVar28]
                                             + uVar24 * 2) * 4);
                }
                if ((fVar34 != fVar33) || (NAN(fVar34) || NAN(fVar33))) {
                  __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                ,0x13b,
                                "void (anonymous namespace)::readFile(const std::string &, int)");
                }
                iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
              }
              if (iVar8 == 2) {
                pvVar11 = data_1._data[uVar23]._data[data_1._data[uVar23]._sizeY * lVar31 + lVar28];
                fVar34 = *(float *)((long)pvVar11 + uVar24 * 4);
                if ((fVar34 != fVar33) || (NAN(fVar34) || NAN(fVar33))) {
                  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
                  poVar9 = std::operator<<(poVar9,", ");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar21);
                  poVar9 = std::operator<<(poVar9," error, should be ");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar20);
                  poVar9 = std::operator<<(poVar9,", is ");
                  poVar9 = (ostream *)
                           std::ostream::operator<<(poVar9,*(float *)((long)pvVar11 + uVar24 * 4));
                  std::endl<char,std::char_traits<char>>(poVar9);
                  std::ostream::flush();
                  fVar34 = *(float *)((long)data_1._data[uVar23]._data
                                            [data_1._data[uVar23]._sizeY * lVar31 + lVar28] +
                                     uVar24 * 4);
                }
                if ((fVar34 != fVar33) || (NAN(fVar34) || NAN(fVar33))) {
                  __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyDeepScanLine.cpp"
                                ,0x147,
                                "void (anonymous namespace)::readFile(const std::string &, int)");
                }
              }
            }
          }
        }
      }
    }
    for (lVar31 = 0; lVar31 != 0xea; lVar31 = lVar31 + 1) {
      for (lVar28 = 0; lVar28 != 0x21a; lVar28 = lVar28 + 1) {
        lVar32 = 4;
        for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
          iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
          if (iVar21 == 0) {
            pvVar11 = *(void **)(*(long *)((long)data_1._data + lVar32 * 4 + -8) * lVar31 * 8 +
                                 *(long *)((long)&(data_1._data)->_sizeX + lVar32 * 4) + lVar28 * 8)
            ;
            if (pvVar11 != (void *)0x0) {
              operator_delete__(pvVar11);
              iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
              goto LAB_0013f113;
            }
          }
          else {
LAB_0013f113:
            if (iVar21 == 1) {
              pvVar11 = *(void **)(*(long *)((long)data_1._data + lVar32 * 4 + -8) * lVar31 * 8 +
                                   *(long *)((long)&(data_1._data)->_sizeX + lVar32 * 4) +
                                  lVar28 * 8);
              if (pvVar11 == (void *)0x0) goto LAB_0013f170;
              operator_delete__(pvVar11);
              iVar21 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
            }
            if ((iVar21 == 2) &&
               (pvVar11 = *(void **)(*(long *)((long)data_1._data + lVar32 * 4 + -8) * lVar31 * 8 +
                                     *(long *)((long)&(data_1._data)->_sizeX + lVar32 * 4) +
                                    lVar28 * 8), pvVar11 != (void *)0x0)) {
              operator_delete__(pvVar11);
            }
          }
LAB_0013f170:
          lVar32 = lVar32 + 6;
        }
      }
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data_1);
    Imf_3_4::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&file);
    Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&type);
    remove(source_filename._M_dataplus._M_p);
    remove(copy_filename._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    uVar23 = (ulong)((int)local_2a8 + 1);
  } while( true );
}

Assistant:

void
readCopyWriteTest (const std::string& tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;

    std::string source_filename =
        tempDir + "imf_test_copy_deep_scanline_source.exr";
    std::string copy_filename =
        tempDir + "imf_test_copy_deep_scanline_copy.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (source_filename, channelCount, compression);
        copyFile (source_filename, copy_filename);
        readFile (copy_filename, channelCount);
        remove (source_filename.c_str ());
        remove (copy_filename.c_str ());
        cout << endl << flush;
    }
}